

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRefs.c
# Opt level: O0

int Abc_NodeMffcInside(Abc_Obj_t *pNode,Vec_Ptr_t *vLeaves,Vec_Ptr_t *vInside)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  int Count2;
  int Count1;
  int i;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vInside_local;
  Vec_Ptr_t *vLeaves_local;
  Abc_Obj_t *pNode_local;
  
  for (Count2 = 0; iVar1 = Vec_PtrSize(vLeaves), Count2 < iVar1; Count2 = Count2 + 1) {
    pvVar3 = Vec_PtrEntry(vLeaves,Count2);
    *(int *)((long)pvVar3 + 0x2c) = *(int *)((long)pvVar3 + 0x2c) + 1;
  }
  iVar1 = Abc_NodeDeref_rec(pNode);
  Abc_NodeMffcConeSupp(pNode,vInside,(Vec_Ptr_t *)0x0);
  iVar2 = Abc_NodeRef_rec(pNode);
  if (iVar1 != iVar2) {
    __assert_fail("Count1 == Count2",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcRefs.c"
                  ,0x16c,"int Abc_NodeMffcInside(Abc_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  for (Count2 = 0; iVar2 = Vec_PtrSize(vLeaves), Count2 < iVar2; Count2 = Count2 + 1) {
    pvVar3 = Vec_PtrEntry(vLeaves,Count2);
    *(int *)((long)pvVar3 + 0x2c) = *(int *)((long)pvVar3 + 0x2c) + -1;
  }
  return iVar1;
}

Assistant:

int Abc_NodeMffcInside( Abc_Obj_t * pNode, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vInside )
{
    Abc_Obj_t * pObj;
    int i, Count1, Count2;
    // increment the fanout counters for the leaves
    Vec_PtrForEachEntry( Abc_Obj_t *, vLeaves, pObj, i )
        pObj->vFanouts.nSize++;
    // dereference the node
    Count1 = Abc_NodeDeref_rec( pNode );
    // collect the nodes inside the MFFC
    Abc_NodeMffcConeSupp( pNode, vInside, NULL );
    // reference it back
    Count2 = Abc_NodeRef_rec( pNode );
    assert( Count1 == Count2 );
    // remove the extra counters
    Vec_PtrForEachEntry( Abc_Obj_t *, vLeaves, pObj, i )
        pObj->vFanouts.nSize--;
    return Count1;
}